

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::printSolution(HModel *this)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  ostream *poVar5;
  int i;
  size_type __n;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int i_1;
  long lVar9;
  char buff [5];
  vector<double,_std::allocator<double>_> dual;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowValue;
  vector<double,_std::allocator<double>_> colDual;
  vector<double,_std::allocator<double>_> value;
  vector<double,_std::allocator<double>_> colValue;
  allocator_type local_bd [5];
  _Vector_base<double,_std::allocator<double>_> local_b8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_70;
  _Vector_base<double,_std::allocator<double>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_58,&this->workValue);
  pdVar3 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    local_58._M_impl.super__Vector_impl_data._M_start[piVar4[uVar7]] = pdVar3[uVar7];
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b8,&this->workDual);
  piVar4 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    local_b8._M_impl.super__Vector_impl_data._M_start[piVar4[uVar7]] = 0.0;
  }
  uVar1 = this->numCol;
  __n = (size_type)(int)uVar1;
  pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    local_58._M_impl.super__Vector_impl_data._M_start[uVar7] =
         pdVar3[uVar7] * local_58._M_impl.super__Vector_impl_data._M_start[uVar7];
    local_b8._M_impl.super__Vector_impl_data._M_start[uVar7] =
         local_b8._M_impl.super__Vector_impl_data._M_start[uVar7] / pdVar3[uVar7];
  }
  pdVar3 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    local_58._M_impl.super__Vector_impl_data._M_start[__n + uVar7] =
         local_58._M_impl.super__Vector_impl_data._M_start[__n + uVar7] / pdVar3[uVar7];
    local_b8._M_impl.super__Vector_impl_data._M_start[__n + uVar7] =
         pdVar3[uVar7] * local_b8._M_impl.super__Vector_impl_data._M_start[__n + uVar7];
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,__n,(allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_70,(long)this->numCol,
             (allocator_type *)&local_88);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,(long)this->numRow,
             (allocator_type *)&local_a0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a0,(long)this->numRow,local_bd);
  iVar2 = this->numCol;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    local_88._M_impl.super__Vector_impl_data._M_start[uVar7] =
         -local_58._M_impl.super__Vector_impl_data._M_start[(long)iVar2 + uVar7];
  }
  uVar1 = this->numCol;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    local_40._M_impl.super__Vector_impl_data._M_start[uVar8] =
         local_58._M_impl.super__Vector_impl_data._M_start[uVar8];
  }
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    local_a0._M_impl.super__Vector_impl_data._M_start[uVar8] =
         local_b8._M_impl.super__Vector_impl_data._M_start[(long)(int)uVar1 + uVar8];
  }
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    local_70._M_impl.super__Vector_impl_data._M_start[uVar6] =
         local_b8._M_impl.super__Vector_impl_data._M_start[uVar6];
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar5,"Col value: ");
  for (lVar9 = 0; lVar9 < this->numCol; lVar9 = lVar9 + 1) {
    sprintf((char *)local_bd,"%2.2f ",local_40._M_impl.super__Vector_impl_data._M_start[lVar9]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,(char *)local_bd);
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar5,"Col dual:  ");
  for (lVar9 = 0; lVar9 < this->numCol; lVar9 = lVar9 + 1) {
    sprintf((char *)local_bd,"%2.2f ",local_70._M_impl.super__Vector_impl_data._M_start[lVar9]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,(char *)local_bd);
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar5,"Row value: ");
  for (lVar9 = 0; lVar9 < this->numRow; lVar9 = lVar9 + 1) {
    sprintf((char *)local_bd,"%2.2f ",local_88._M_impl.super__Vector_impl_data._M_start[lVar9]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,(char *)local_bd);
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar5,"Row dual:  ");
  for (lVar9 = 0; lVar9 < this->numRow; lVar9 = lVar9 + 1) {
    sprintf((char *)local_bd,"%2.2f ",local_a0._M_impl.super__Vector_impl_data._M_start[lVar9]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,(char *)local_bd);
  }
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void HModel::printSolution() {

	//*************** part 1 : in .solve() 
	// Take primal solution
	vector<double> value = workValue;
	for (int iRow = 0; iRow < numRow; iRow++)
		value[basicIndex[iRow]] = baseValue[iRow];

	// Take dual solution
	vector<double> dual = workDual;
	for (int iRow = 0; iRow < numRow; iRow++)
		dual[basicIndex[iRow]] = 0;

	// Take non basic flag and move don't need those?
	//houtput.Nflag = Nflag_;
	//houtput.Nmove = Nmove_;

	// Scale back 
	for (int iCol = 0; iCol < numCol; iCol++) {
		value[iCol] *= colScale[iCol];
		dual[iCol] /= colScale[iCol];

	}
	for (int iRow = 0, iTot = numCol; iRow < numRow; iRow++, iTot++) {
		value[iTot] /= rowScale[iRow];
		dual[iTot] *= rowScale[iRow];
	}
	
	//************** part 2: gepr and gedu

	// Now we can get the solution
	vector<double> colValue(numCol), colDual(numCol); 
	vector<double> rowValue(numRow), rowDual(numRow);
	
	// hems_gepr hems_gedu after model has been solved 
	// always call that function with numRow + 1 for rowListSize and same for col 
	//hems_gepr(&returnCode, 0, numRow + 1), numCol + 1, 0, 0, &rowValue[0], &colValue[0]);
	double *valuePtr = &value[0];
//    if (rowListSize > numRow) {
        for (int i = 0; i < numRow; i++)
            rowValue[i] = -valuePtr[i + numCol];
//    } else {
//        for (int i = 0; i < rowListSize; i++)
//            rowValue[i] = -valuePtr[rowList[i] + numCol - 1];
//    }
//    if (colListSize > numCol) {
        for (int i = 0; i < numCol; i++)
            colValue[i] = valuePtr[i];
//    } else {
 //       for (int i = 0; i < colListSize; i++)
  //          colValue[i] = valuePtr[colList[i] - 1];
   // }
    
    //hems_gedu(&returnCode, 0, numRow + 1, numCol + 1, 0, 0, &rowDual[0], &colDual[0]);
	
//    if (rowListSize > numRow) {
        for (int i = 0; i < numRow; i++)
            rowDual[i] = dual[i + numCol];
//    } else {
  //      for (int i = 0; i < rowListSize; i++)
   //         rowDual[i] = dual[rowList[i] + numCol - 1];
   // }

 //   if (colListSize > numCol) {
        for (int i = 0; i < numCol; i++)
            colDual[i] = dual[i];
 //   } else {
  //      for (int i = 0; i < colListSize; i++)
   //         colDual[i] = dual[colList[i] - 1];
   // }
    //*rtcod = 0;*/
    
    char buff [5];
    cout<<endl<<"Col value: ";
    for (int i=0;i<numCol;i++) {
    	sprintf(buff, "%2.2f ", colValue[i]); 
    	cout<<setw(5)<<buff; }  //cout<< colValue[i] <<" ";
    cout<<endl<<"Col dual:  ";
    for (int i=0;i<numCol;i++) {
    	sprintf(buff, "%2.2f ", colDual[i]);
    	cout<<setw(5)<<buff; }  //cout<< colDual[i] <<" ";
    cout<<endl<<"Row value: ";
    for (int i=0;i<numRow;i++) {
      	sprintf(buff, "%2.2f ", rowValue[i]);  
      	cout<<setw(5)<<buff; }  //cout<< rowValue[i] <<" ";
    cout<<endl<<"Row dual:  ";
    for (int i=0;i<numRow;i++) {
    	sprintf(buff, "%2.2f ", rowDual[i]);  
    	cout<<setw(5)<<buff; }  //cout<< rowDual[i] <<" "; 
    cout<<endl<<endl;
}